

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int entropy_gather_internal(mbedtls_entropy_context *ctx)

{
  int iVar1;
  size_t local_b0;
  size_t olen;
  uchar buf [128];
  int local_20;
  int have_one_strong;
  int i;
  int ret;
  mbedtls_entropy_context *ctx_local;
  
  buf[0x7c] = '\0';
  buf[0x7d] = '\0';
  buf[0x7e] = '\0';
  buf[0x7f] = '\0';
  if (ctx->source_count == 0) {
    ctx_local._4_4_ = -0x40;
  }
  else {
    for (local_20 = 0; local_20 < ctx->source_count; local_20 = local_20 + 1) {
      if (ctx->source[local_20].strong == 1) {
        buf[0x7c] = '\x01';
        buf[0x7d] = '\0';
        buf[0x7e] = '\0';
        buf[0x7f] = '\0';
      }
      local_b0 = 0;
      iVar1 = (*ctx->source[local_20].f_source)
                        (ctx->source[local_20].p_source,(uchar *)&olen,0x80,&local_b0);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_b0 != 0) {
        entropy_update(ctx,(uchar)local_20,(uchar *)&olen,local_b0);
        ctx->source[local_20].size = local_b0 + ctx->source[local_20].size;
      }
    }
    if (buf._124_4_ == 0) {
      ctx_local._4_4_ = -0x3d;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int entropy_gather_internal( mbedtls_entropy_context *ctx )
{
    int ret, i, have_one_strong = 0;
    unsigned char buf[MBEDTLS_ENTROPY_MAX_GATHER];
    size_t olen;

    if( ctx->source_count == 0 )
        return( MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED );

    /*
     * Run through our entropy sources
     */
    for( i = 0; i < ctx->source_count; i++ )
    {
        if( ctx->source[i].strong == MBEDTLS_ENTROPY_SOURCE_STRONG )
            have_one_strong = 1;

        olen = 0;
        if( ( ret = ctx->source[i].f_source( ctx->source[i].p_source,
                        buf, MBEDTLS_ENTROPY_MAX_GATHER, &olen ) ) != 0 )
        {
            return( ret );
        }

        /*
         * Add if we actually gathered something
         */
        if( olen > 0 )
        {
            entropy_update( ctx, (unsigned char) i, buf, olen );
            ctx->source[i].size += olen;
        }
    }

    if( have_one_strong == 0 )
        return( MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE );

    return( 0 );
}